

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void lts2::PerformRIHTOnImage
               (Mat *anImage,Size *patchSize,Point *patchOffset,LBDOperator *LBD,Mat *result,
               int iterations,float sparsity,float patchMean)

{
  _InputArray *p_Var1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float patchMean_00;
  Rect ROI;
  Mat target;
  Mat inputPatch;
  Mat resultPatch;
  Mat freak;
  Mat patchOnes;
  Mat ocount;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  Mat *local_438;
  LBDOperator *local_430;
  Size local_428;
  _OutputArray local_420;
  _InputArray local_408;
  _InputArray local_3f0 [4];
  string local_390 [3];
  int local_330;
  int local_32c;
  ulong local_328;
  ulong local_320;
  long *local_318;
  undefined8 uStack_310;
  long local_308 [12];
  Mat local_2a8 [96];
  Mat local_248 [152];
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  _InputArray local_90 [4];
  
  local_430 = LBD;
  if ((*(uint *)anImage & 0xfff) == 5) {
    local_320 = **(ulong **)(anImage + 0x40) << 0x20 | **(ulong **)(anImage + 0x40) >> 0x20;
    cv::Mat::create(result,&local_320,5);
    local_90[0].obj = &local_318;
    local_308[0] = 0;
    local_308[1] = 0;
    local_318 = (long *)0x0;
    uStack_310 = 0;
    local_90[0].flags = -0x3efdfffa;
    local_90[0].sz = (Size)&DAT_400000001;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,local_90);
    local_328 = **(ulong **)(anImage + 0x40) << 0x20 | **(ulong **)(anImage + 0x40) >> 0x20;
    local_308[0] = 0;
    local_308[1] = 0;
    local_318 = (long *)0x0;
    uStack_310 = 0;
    cv::Mat::Mat((Mat *)local_90,&local_328,5,&local_318);
    local_330 = patchSize->width;
    local_32c = patchSize->height;
    cv::Mat::ones(&local_318,&local_330,5);
    local_438 = result;
    cv::Mat::Mat(local_f0);
    (**(code **)(*local_318 + 0x18))(local_318,&local_318,local_f0,0xffffffff);
    cv::Mat::~Mat(local_248);
    cv::Mat::~Mat(local_2a8);
    cv::Mat::~Mat((Mat *)local_308);
    cv::Mat::Mat((Mat *)&local_318);
    cv::Mat::Mat(local_150);
    cv::Mat::Mat(local_1b0);
    iVar5 = patchOffset->x;
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    iVar3 = 1;
    if (1 < patchOffset->y) {
      iVar3 = patchOffset->y;
    }
    patchOffset->x = iVar5;
    patchOffset->y = iVar3;
    if (0 < *(int *)(anImage + 8)) {
      iVar5 = 0;
      do {
        iVar3 = *(int *)(anImage + 0xc);
        if (0 < iVar3) {
          iVar4 = 0;
          do {
            local_440 = patchSize->width;
            local_43c = patchSize->height;
            local_448 = iVar4;
            local_444 = iVar5;
            if ((local_43c + iVar5 <= *(int *)(anImage + 8)) && (local_440 + iVar4 <= iVar3)) {
              cv::Mat::Mat((Mat *)local_390,anImage,(Rect_ *)&local_448);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x2010000;
              local_3f0[0].obj = &local_318;
              cv::Mat::copyTo((_OutputArray *)local_390);
              cv::Mat::~Mat((Mat *)local_390);
              patchMean_00 = patchMean;
              if (patchMean < 0.0) {
                local_3f0[0].sz.width = 0;
                local_3f0[0].sz.height = 0;
                local_3f0[0].flags = 0x1010000;
                local_3f0[0].obj = &local_318;
                cv::noArray();
                cv::mean((_InputArray *)local_390,local_3f0);
                patchMean_00 = (float)(double)local_390[0]._M_dataplus._M_p;
              }
              (*(local_430->super_LinearOperator)._vptr_LinearOperator[2])
                        (local_430,&local_318,local_150);
              local_428.width = patchSize->width;
              local_428.height = patchSize->height;
              local_390[0]._M_dataplus._M_p = (pointer)&local_390[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"haar","");
              RealReconstructionWithIHT
                        (local_1b0,local_430,local_150,iterations,sparsity,&local_428,patchMean_00,2
                         ,local_390);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390[0]._M_dataplus._M_p != &local_390[0].field_2) {
                operator_delete(local_390[0]._M_dataplus._M_p,
                                local_390[0].field_2._M_allocated_capacity + 1);
              }
              cv::Mat::Mat((Mat *)local_390,local_438,(Rect_ *)&local_448);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_408.sz.width = 0;
              local_408.sz.height = 0;
              local_408.flags = 0x1010000;
              local_408.obj = local_1b0;
              local_420.super__InputArray.sz.width = 0;
              local_420.super__InputArray.sz.height = 0;
              local_420.super__InputArray.flags = -0x3dff0000;
              local_420.super__InputArray.obj = local_390;
              local_3f0[0].obj = local_390;
              p_Var1 = (_InputArray *)cv::noArray();
              cv::add(local_3f0,&local_408,&local_420,p_Var1,-1);
              cv::Mat::Mat((Mat *)local_3f0,(Mat *)local_90,(Rect_ *)&local_448);
              cv::Mat::operator=((Mat *)local_390,(Mat *)local_3f0);
              cv::Mat::~Mat((Mat *)local_3f0);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_408.sz.width = 0;
              local_408.sz.height = 0;
              local_408.flags = 0x1010000;
              local_408.obj = local_f0;
              local_420.super__InputArray.sz.width = 0;
              local_420.super__InputArray.sz.height = 0;
              local_420.super__InputArray.flags = -0x3dff0000;
              local_420.super__InputArray.obj = local_390;
              local_3f0[0].obj = local_390;
              p_Var1 = (_InputArray *)cv::noArray();
              cv::add(local_3f0,&local_408,&local_420,p_Var1,-1);
              cv::Mat::~Mat((Mat *)local_390);
            }
            iVar4 = iVar4 + patchOffset->x;
            iVar3 = *(int *)(anImage + 0xc);
          } while (iVar4 < iVar3);
        }
        iVar5 = iVar5 + patchOffset->y;
      } while (iVar5 < *(int *)(anImage + 8));
    }
    finalize(local_438,(Mat *)local_90);
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat((Mat *)&local_318);
    cv::Mat::~Mat(local_f0);
    cv::Mat::~Mat((Mat *)local_90);
    return;
  }
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"anImage.type() == CV_32F && anImage.channels() == 1","");
  uVar2 = cv::error(-0xd7,(string *)&local_318,"PerformRIHTOnImage",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x371);
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void lts2::PerformRIHTOnImage(cv::Mat const &anImage, cv::Size patchSize, cv::Point patchOffset,
                             LBDOperator &LBD, cv::Mat &result, int iterations, float sparsity, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);


  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  patchOffset.x = MAX(1, patchOffset.x);
  patchOffset.y = MAX(1, patchOffset.y);

  for (int y = 0; y < anImage.rows; y += patchOffset.y)
    for (int x = 0; x < anImage.cols; x += patchOffset.x)
    {
      cv::Rect ROI(x, y, patchSize.width, patchSize.height);
      if ( y+patchSize.height > anImage.rows ||
           x+patchSize.width > anImage.cols )
        continue;

      anImage(ROI).copyTo(inputPatch);
      float pmean = patchMean;
      if (pmean < 0.0)
      {
        cv::Scalar mean = cv::mean(inputPatch);
        pmean = (float)mean[0];
      }

      LBD.Apply(inputPatch, freak);

      lts2::RealReconstructionWithIHT(resultPatch, LBD, freak,
                                      iterations, sparsity, patchSize, pmean);

      cv::Mat target = result(ROI);
      target += resultPatch;

      target = ocount(ROI);
      target += patchOnes;
    }

  finalize(result, ocount);
}